

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

char * Wlc_PrsFindName(char *pStr,char **ppPlace)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  pcVar3 = Wlc_PrsFindName::Buffer;
  *ppPlace = Wlc_PrsFindName::Buffer;
  pcVar4 = pStr + -1;
  do {
    bVar1 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
  } while (bVar1 == 0x20);
  if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    if (bVar1 == 0) {
      pcVar3 = Wlc_PrsFindName::Buffer;
      goto LAB_0037571b;
    }
  }
  else if ((0x3b < bVar1 - 0x24) ||
          ((0x900000000000001U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) == 0)) {
    return (char *)0x0;
  }
  bVar5 = true;
  iVar2 = 0;
  do {
    if (bVar5) {
      if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
        bVar5 = true;
        goto joined_r0x003756e7;
      }
      bVar5 = true;
      if (bVar1 != 0x24) {
        if (bVar1 == 0x5c) goto LAB_003756f5;
        if (bVar1 == 0x5f) goto LAB_00375703;
        break;
      }
    }
    else {
      if (bVar1 == 0x20) {
        iVar2 = iVar2 + -1;
        bVar5 = iVar2 == 0;
        goto LAB_00375703;
      }
      bVar5 = false;
joined_r0x003756e7:
      if (bVar1 == 0x5c) {
LAB_003756f5:
        iVar2 = iVar2 + 1;
        bVar5 = false;
      }
    }
LAB_00375703:
    *pcVar3 = bVar1;
    pcVar3 = (char *)((byte *)pcVar3 + 1);
    bVar1 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
  } while (bVar1 != 0);
LAB_0037571b:
  *pcVar3 = 0;
  return pcVar4;
}

Assistant:

static inline char * Wlc_PrsFindName( char * pStr, char ** ppPlace )
{
    static char Buffer[WLV_PRS_MAX_LINE];
    char * pThis = *ppPlace = Buffer;
    int fNotName = 1, Count = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( !Wlc_PrsIsChar(pStr) )
        return NULL;
//    while ( Wlc_PrsIsChar(pStr) )
//        *pThis++ = *pStr++;
    while ( *pStr )
    {
        if ( fNotName && !Wlc_PrsIsChar(pStr) )
            break;
        if ( *pStr == '\\' )
        {
            Count++;
            fNotName = 0;
        }
        else if ( !fNotName && *pStr == ' ' )
        {
            Count--;
            if ( !Count )
                fNotName = 1;
        }
        *pThis++ = *pStr++;
    }
    *pThis = 0;
    return pStr;
}